

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

double duckdb::AtanhOperator::Operation<double,double>(double input)

{
  InvalidInputException *this;
  double dVar1;
  allocator local_39;
  string local_38;
  
  if (1.0 < ABS(input)) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"ATANH is undefined outside [-1,1]",&local_39);
    InvalidInputException::InvalidInputException(this,&local_38);
    __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((input != -1.0) || (NAN(input))) && ((input != 1.0 || (NAN(input))))) {
    dVar1 = atanh(input);
    return dVar1;
  }
  return INFINITY;
}

Assistant:

static inline TR Operation(TA input) {
		if (input < -1 || input > 1) {
			throw InvalidInputException("ATANH is undefined outside [-1,1]");
		}
		if (input == -1 || input == 1) {
			return INFINITY;
		}
		return (double)std::atanh(input);
	}